

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

void __thiscall CPU::CPX_IM(CPU *this)

{
  int iVar1;
  byte bVar2;
  
  this->cycles = 2;
  iVar1 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)this->pc);
  this->pc = this->pc + 1;
  this->cycles = this->cycles - 1;
  bVar2 = this->X - (byte)iVar1;
  (this->field_6).ps =
       bVar2 & 0x80 | (bVar2 == 0) * '\x02' | (byte)iVar1 <= this->X | (this->field_6).ps & 0x7c;
  return;
}

Assistant:

void CPU::CPX_IM()
{
    cycles = 2;
    uint8_t op = GetByte();
    uint8_t res = X - op;
    C = (X >= op);
    Z = (X == op);
    N = (res & 0b10000000) > 0;
}